

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_add_offset(roaring_bitmap_t *bm,int64_t offset)

{
  container_t *c;
  byte bVar1;
  uint uVar2;
  roaring_array_t *ra;
  ulong uVar3;
  container_t *pcVar4;
  roaring_bitmap_t *prVar5;
  uint8_t typecode;
  uint16_t offset_00;
  ulong uVar6;
  container_t **hic;
  long lVar7;
  int iVar8;
  container_t **loc;
  array_container_t *c_00;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t new_t;
  container_t *hi;
  container_t *lo;
  uint8_t local_71;
  uint local_70;
  uint local_6c;
  roaring_array_t *local_68;
  uint local_5c;
  roaring_bitmap_t *local_58;
  long local_50;
  container_t *local_48;
  container_t *local_40;
  container_t *local_38;
  
  if (offset == 0) {
    prVar5 = roaring_bitmap_copy(bm);
    return prVar5;
  }
  uVar2 = (bm->high_low_container).size;
  local_50 = offset >> 0x10;
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  bVar1 = (bm->high_low_container).flags & 1;
  ra->flags = ra->flags & 0xfe | bVar1;
  local_68 = ra;
  if ((short)offset == 0) {
    if (0 < (int)uVar2) {
      iVar8 = 0;
      local_6c = (uint)bVar1;
      uVar10 = 0;
      do {
        uVar11 = (ulong)(bm->high_low_container).keys[uVar10 & 0xffff] + local_50;
        if (uVar11 < 0x10000) {
          ra_append_copy(ra,&bm->high_low_container,(uint16_t)uVar10,SUB41(local_6c,0));
          lVar7 = (long)iVar8;
          iVar8 = iVar8 + 1;
          ra->keys[lVar7] = (uint16_t)uVar11;
        }
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar2 != uVar9);
    }
  }
  else {
    if (0 < (int)uVar2) {
      local_70 = (uint)offset & 0xffff;
      uVar10 = 0;
      local_6c = uVar2;
      local_58 = bm;
      do {
        local_48 = (container_t *)0x0;
        local_40 = (container_t *)0x0;
        uVar3 = uVar10 & 0xffff;
        uVar6 = (ulong)(bm->high_low_container).keys[uVar3];
        uVar11 = local_50 + uVar6;
        loc = &local_40;
        if (0xffff < uVar11) {
          loc = (container_t **)0x0;
        }
        hic = &local_48;
        if ((uVar6 + local_50) - 0xffff < 0xffffffffffff0000) {
          hic = (container_t **)0x0;
        }
        if (0xfffffffffffefffe < uVar11 - 0x10000) {
          typecode = (bm->high_low_container).typecodes[uVar3];
          c_00 = (array_container_t *)(bm->high_low_container).containers[uVar3];
          if (typecode == '\x04') {
            typecode = *(uint8_t *)&c_00->array;
            c_00 = *(array_container_t **)c_00;
          }
          offset_00 = (uint16_t)local_70;
          if (typecode == '\x03') {
            run_container_offset((run_container_t *)c_00,loc,hic,offset_00);
          }
          else if (typecode == '\x02') {
            array_container_offset(c_00,loc,hic,offset_00);
          }
          else {
            bitset_container_offset((bitset_container_t *)c_00,loc,hic,offset_00);
          }
          c = local_40;
          if (local_40 != (container_t *)0x0) {
            lVar7 = (long)ra->size;
            if ((lVar7 == 0) ||
               (uVar2 = ra->size - 1U & 0xffff, (uint)ra->keys[uVar2] != (uint)uVar11)) {
              ra_append(ra,(uint16_t)uVar11,local_40,typecode);
              bm = local_58;
            }
            else {
              local_38 = ra->containers[uVar2];
              local_5c = (uint)ra->typecodes[uVar2];
              pcVar4 = container_ior(local_38,ra->typecodes[uVar2],local_40,typecode,&local_71);
              ra->containers[lVar7 + -1] = pcVar4;
              ra->typecodes[lVar7 + -1] = local_71;
              if (local_38 != pcVar4) {
                container_free(local_38,(uint8_t)local_5c);
              }
              container_free(c,typecode);
              bm = local_58;
              ra = local_68;
            }
          }
          uVar2 = local_6c;
          if (local_48 != (container_t *)0x0) {
            ra_append(ra,(uint16_t)uVar11 + 1,local_48,typecode);
          }
        }
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar2 != uVar9);
    }
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)ra);
  }
  return (roaring_bitmap_t *)local_68;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_add_offset(const roaring_bitmap_t *bm,
                                            int64_t offset) {
    roaring_bitmap_t *answer;
    roaring_array_t *ans_ra;
    int64_t container_offset;
    uint16_t in_offset;

    const roaring_array_t *bm_ra = &bm->high_low_container;
    int length = bm_ra->size;

    if (offset == 0) {
        return roaring_bitmap_copy(bm);
    }

    container_offset = offset >> 16;
    in_offset = (uint16_t)(offset - container_offset * (1 << 16));

    answer = roaring_bitmap_create();
    bool cow = is_cow(bm);
    roaring_bitmap_set_copy_on_write(answer, cow);

    ans_ra = &answer->high_low_container;

    if (in_offset == 0) {
        ans_ra = &answer->high_low_container;

        for (int i = 0, j = 0; i < length; ++i) {
            int64_t key = ra_get_key_at_index(bm_ra, (uint16_t)i);
            key += container_offset;

            if (key < 0 || key >= (1 << 16)) {
                continue;
            }
            ra_append_copy(ans_ra, bm_ra, (uint16_t)i, cow);
            ans_ra->keys[j++] = (uint16_t)key;
        }
        return answer;
    }

    uint8_t t;
    const container_t *c;
    container_t *lo, *hi, **lo_ptr, **hi_ptr;
    int64_t k;

    for (int i = 0; i < length; ++i) {
        lo = hi = NULL;
        lo_ptr = hi_ptr = NULL;

        k = ra_get_key_at_index(bm_ra, (uint16_t)i) + container_offset;
        if (k >= 0 && k < (1 << 16)) {
            lo_ptr = &lo;
        }
        if (k + 1 >= 0 && k + 1 < (1 << 16)) {
            hi_ptr = &hi;
        }
        if (lo_ptr == NULL && hi_ptr == NULL) {
            continue;
        }
        c = ra_get_container_at_index(bm_ra, (uint16_t)i, &t);
        c = container_unwrap_shared(c, &t);

        container_add_offset(c, t, lo_ptr, hi_ptr, in_offset);
        if (lo != NULL) {
            offset_append_with_merge(ans_ra, (int)k, lo, t);
        }
        if (hi != NULL) {
            ra_append(ans_ra, (uint16_t)(k + 1), hi, t);
        }
        // the `lo` and `hi` container type always keep same as container `c`.
        // in the case of `container_add_offset` on bitset container, `lo` and
        // `hi` may has small cardinality, they must be repaired to array
        // container.
    }

    roaring_bitmap_repair_after_lazy(answer);  // do required type conversions.
    return answer;
}